

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FunctionPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPrototypeSyntax,slang::syntax::FunctionPrototypeSyntax_const&>
          (BumpAllocator *this,FunctionPrototypeSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  DataTypeSyntax *pDVar4;
  NameSyntax *pNVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  FunctionPrototypeSyntax *pFVar10;
  
  pFVar10 = (FunctionPrototypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionPrototypeSyntax *)this->endPtr < pFVar10 + 1) {
    pFVar10 = (FunctionPrototypeSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pFVar10 + 1);
  }
  (pFVar10->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar6 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pFVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pFVar10->super_SyntaxNode).field_0x4 = uVar6;
  (pFVar10->super_SyntaxNode).parent = pSVar1;
  uVar7 = (args->keyword).field_0x2;
  NVar8.raw = (args->keyword).numFlags.raw;
  uVar9 = (args->keyword).rawLen;
  pIVar2 = (args->keyword).info;
  (pFVar10->keyword).kind = (args->keyword).kind;
  (pFVar10->keyword).field_0x2 = uVar7;
  (pFVar10->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pFVar10->keyword).rawLen = uVar9;
  (pFVar10->keyword).info = pIVar2;
  uVar6 = *(undefined4 *)&(args->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->specifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar10->specifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->specifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar10->specifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pFVar10->specifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar10->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->specifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar10->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pFVar10->specifiers).super_SyntaxListBase.childCount =
       (args->specifiers).super_SyntaxListBase.childCount;
  sVar3 = (args->specifiers).
          super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pFVar10->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->specifiers).
           super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>._M_ptr;
  (pFVar10->specifiers).super_span<slang::syntax::ClassSpecifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar3;
  (pFVar10->specifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f8f38;
  uVar7 = (args->lifetime).field_0x2;
  NVar8.raw = (args->lifetime).numFlags.raw;
  uVar9 = (args->lifetime).rawLen;
  pIVar2 = (args->lifetime).info;
  pDVar4 = (args->returnType).ptr;
  pNVar5 = (args->name).ptr;
  (pFVar10->lifetime).kind = (args->lifetime).kind;
  (pFVar10->lifetime).field_0x2 = uVar7;
  (pFVar10->lifetime).numFlags = (NumericTokenFlags)NVar8.raw;
  (pFVar10->lifetime).rawLen = uVar9;
  (pFVar10->lifetime).info = pIVar2;
  (pFVar10->returnType).ptr = pDVar4;
  (pFVar10->name).ptr = pNVar5;
  pFVar10->portList = args->portList;
  return pFVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }